

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

void __thiscall
sqlite_orm::internal::object_from_column_builder<relive::Track>::operator()
          (object_from_column_builder<relive::Track> *this,
          column_t<relive::Track,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Track::*)()_const,_void_(relive::Track::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *c)

{
  int columnIndex;
  code *pcVar1;
  string value;
  row_extractor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_59;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  columnIndex = (this->super_object_from_column_builder_base).index;
  (this->super_object_from_column_builder_base).index = columnIndex + 1;
  row_extractor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::extract(&local_58,&local_59,(this->super_object_from_column_builder_base).stmt,columnIndex);
  if (c->member_pointer == 0xffffffffffffffff) {
    pcVar1 = (code *)c->setter;
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *(long *)((long)&this->object->_id + *(long *)&c->field_0x40) +
                                   -1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      local_28._8_4_ = local_58.field_2._8_4_;
      local_28._12_4_ = local_58.field_2._12_4_;
      local_38 = &local_28;
    }
    else {
      local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_58._M_dataplus._M_p;
    }
    local_28._M_allocated_capacity._4_4_ = local_58.field_2._M_allocated_capacity._4_4_;
    local_28._M_allocated_capacity._0_4_ = local_58.field_2._M_allocated_capacity._0_4_;
    local_30 = local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity._0_4_ =
         local_58.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    (*pcVar1)();
    if (local_38 != &local_28) {
      operator_delete(local_38,local_28._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::operator=
              ((string *)((long)&this->object->_id + c->member_pointer),(string *)&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             local_58.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return;
}

Assistant:

void operator()(const C &c) const {
        using field_type = typename C::field_type;
        auto value = row_extractor<field_type>().extract(this->stmt, this->index++);
        if(c.member_pointer) {
            this->object.*c.member_pointer = std::move(value);
        } else {
            ((this->object).*(c.setter))(std::move(value));
        }
    }